

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O3

make_caster<std::__cxx11::basic_string<char>_> * __thiscall
pybind11::detail::load_type<std::__cxx11::string>
          (make_caster<std::__cxx11::basic_string<char>_> *__return_storage_ptr__,detail *this,
          handle *handle)

{
  (__return_storage_ptr__->value)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->value).field_2;
  (__return_storage_ptr__->value)._M_string_length = 0;
  (__return_storage_ptr__->value).field_2._M_local_buf[0] = '\0';
  __return_storage_ptr__->success = false;
  load_type<std::__cxx11::string,void>(__return_storage_ptr__,(handle *)this);
  return __return_storage_ptr__;
}

Assistant:

make_caster<T> load_type(const handle &handle) {
    make_caster<T> conv;
    load_type(conv, handle);
    return conv;
}